

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

void google::DemangleInplace(char *out,int out_size)

{
  bool bVar1;
  size_t sVar2;
  size_t len;
  char demangled [256];
  int out_size_local;
  char *out_local;
  
  demangled._252_4_ = out_size;
  bVar1 = Demangle(out,(char *)&len,0x100);
  if ((bVar1) && (sVar2 = strlen((char *)&len), sVar2 + 1 <= (ulong)(long)(int)demangled._252_4_)) {
    if (0xff < sVar2) {
      AssertFail();
    }
    memmove(out,&len,sVar2 + 1);
  }
  return;
}

Assistant:

static ATTRIBUTE_NOINLINE void DemangleInplace(char *out, int out_size) {
  char demangled[256];  // Big enough for sane demangled symbols.
  if (Demangle(out, demangled, sizeof(demangled))) {
    // Demangling succeeded. Copy to out if the space allows.
    size_t len = strlen(demangled);
    if (len + 1 <= (size_t)out_size) {  // +1 for '\0'.
      SAFE_ASSERT(len < sizeof(demangled));
      memmove(out, demangled, len + 1);
    }
  }
}